

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::CleanUpInlineCaches<false>(FunctionBody *this)

{
  InlineCache *this_00;
  IsInstInlineCache *this_01;
  FunctionCodeGenRuntimeData *pFVar1;
  bool bVar2;
  uint32 uVar3;
  PropertyId PVar4;
  uint uVar5;
  uint32 uVar6;
  RootObjectBase *this_02;
  void *pvVar7;
  FunctionBodyPolymorphicInlineCache *this_03;
  InlineCacheAllocator *this_04;
  IsInstInlineCache *inlineCache_1;
  ulong uVar8;
  InlineCache *inlineCache;
  CacheAllocator *this_05;
  anon_class_16_2_3f4a2e36 fn;
  anon_class_16_2_3f4a2e36 fn_00;
  FunctionCodeGenRuntimeData *local_40;
  Type runtimeData;
  uint unregisteredInlineCacheCount;
  
  runtimeData.ptr._4_4_ = 0;
  if ((this->inlineCaches).ptr != (void **)0x0) {
    uVar3 = GetCountField(this,RootObjectLoadInlineCacheStart);
    if (uVar3 == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        this_00 = (InlineCache *)(this->inlineCaches).ptr[uVar8];
        if (this_00 != (InlineCache *)0x0) {
          bVar2 = InlineCache::RemoveFromInvalidationList(this_00);
          if (bVar2) {
            runtimeData.ptr._4_4_ = runtimeData.ptr._4_4_ + 1;
          }
          this_04 = &((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     inlineCacheAllocator;
          Memory::InlineCacheAllocator::Unlock(this_04);
          Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::Free
                    (&this_04->
                      super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                     ,this_00,0x20);
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    this_02 = GetRootObject(this);
    uVar3 = GetCountField(this,RootObjectLoadMethodInlineCacheStart);
    if ((uint)uVar8 < uVar3) {
      uVar8 = uVar8 & 0xffffffff;
      do {
        if ((this->inlineCaches).ptr[uVar8] != (void *)0x0) {
          PVar4 = GetPropertyIdFromCacheId(this,(uint)uVar8);
          uVar5 = RootObjectBase::ReleaseInlineCache(this_02,PVar4,false,false,false);
          runtimeData.ptr._4_4_ = runtimeData.ptr._4_4_ + uVar5;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    uVar3 = GetCountField(this,RootObjectStoreInlineCacheStart);
    if ((uint)uVar8 < uVar3) {
      uVar8 = uVar8 & 0xffffffff;
      do {
        if ((this->inlineCaches).ptr[uVar8] != (void *)0x0) {
          PVar4 = GetPropertyIdFromCacheId(this,(uint)uVar8);
          uVar5 = RootObjectBase::ReleaseInlineCache(this_02,PVar4,true,false,false);
          runtimeData.ptr._4_4_ = runtimeData.ptr._4_4_ + uVar5;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    uVar3 = GetCountField(this,InlineCacheCount);
    if ((uint)uVar8 < uVar3) {
      uVar8 = uVar8 & 0xffffffff;
      do {
        if ((this->inlineCaches).ptr[uVar8] != (void *)0x0) {
          PVar4 = GetPropertyIdFromCacheId(this,(uint)uVar8);
          uVar5 = RootObjectBase::ReleaseInlineCache(this_02,PVar4,false,true,false);
          runtimeData.ptr._4_4_ = runtimeData.ptr._4_4_ + uVar5;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    uVar3 = GetCountField(this,InlineCacheCount);
    uVar6 = GetCountField(this,IsInstInlineCacheCount);
    if ((uint)uVar8 < uVar6 + uVar3) {
      uVar8 = uVar8 & 0xffffffff;
      do {
        this_01 = (IsInstInlineCache *)(this->inlineCaches).ptr[uVar8];
        if (this_01 != (IsInstInlineCache *)0x0) {
          IsInstInlineCache::Unregister
                    (this_01,(this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext
                    );
          this_05 = &((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     isInstInlineCacheAllocator;
          Memory::CacheAllocator::Unlock(this_05);
          Memory::ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>::Free
                    (&this_05->
                      super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>,
                     this_01,0x20);
        }
        uVar8 = uVar8 + 1;
      } while (uVar6 + uVar3 != uVar8);
    }
    (this->inlineCaches).ptr = (void **)0x0;
  }
  pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenRuntimeData);
  if ((pvVar7 != (void *)0x0) && (this->profiledCallSiteCount != 0)) {
    uVar8 = 0;
    do {
      pFVar1 = *(FunctionCodeGenRuntimeData **)((long)pvVar7 + uVar8 * 8);
      if (pFVar1 != (FunctionCodeGenRuntimeData *)0x0) {
        fn.this = this;
        fn.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<false>()::_lambda(Js::InlineCache*)_1_>
                  (pFVar1,fn);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->profiledCallSiteCount);
  }
  pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CodeGenGetSetRuntimeData);
  if ((pvVar7 != (void *)0x0) && (uVar3 = GetCountField(this,InlineCacheCount), uVar3 != 0)) {
    uVar8 = 0;
    do {
      pFVar1 = *(FunctionCodeGenRuntimeData **)((long)pvVar7 + uVar8 * 8);
      Memory::Recycler::WBSetBit((char *)&local_40);
      local_40 = pFVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
      if (local_40 != (FunctionCodeGenRuntimeData *)0x0) {
        fn_00.this = this;
        fn_00.unregisteredInlineCacheCount = (uint *)((long)&runtimeData.ptr + 4);
        FunctionCodeGenRuntimeData::
        MapInlineCaches<Js::FunctionBody::CleanUpInlineCaches<false>()::_lambda(Js::InlineCache*)_2_>
                  (local_40,fn_00);
      }
      uVar8 = uVar8 + 1;
      uVar3 = GetCountField(this,InlineCacheCount);
    } while (uVar8 < uVar3);
  }
  if (runtimeData.ptr._4_4_ != 0) {
    ThreadContext::NotifyInlineCacheBatchUnregistered
              (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               threadContext,runtimeData.ptr._4_4_);
  }
  while (pvVar7 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,PolymorphicInlineCachesHead),
        pvVar7 != (void *)0x0) {
    this_03 = (FunctionBodyPolymorphicInlineCache *)
              FunctionProxy::GetAuxPtr((FunctionProxy *)this,PolymorphicInlineCachesHead);
    FunctionBodyPolymorphicInlineCache::Finalize(this_03,false);
  }
  (this->polymorphicInlineCaches).inlineCaches.ptr =
       (WriteBarrierPtr<Js::PolymorphicInlineCache> *)0x0;
  (this->polymorphicInlineCaches).inlineCacheCount = 0;
  return;
}

Assistant:

void FunctionBody::CleanUpInlineCaches()
    {
        uint unregisteredInlineCacheCount = 0;

        if (nullptr != this->inlineCaches)
        {
            // Inline caches are in this order
            //      plain inline cache
            //      root object load inline cache
            //      root object store inline cache
            //      isInst inline cache
            // The inlineCacheCount includes all but isInst inline cache

            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            for (; i < plainInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    InlineCache* inlineCache = (InlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        if (inlineCache->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;
                        }
                        AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            RootObjectBase * rootObjectBase = this->GetRootObject();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), true, false, IsScriptContextShutdown);
                    }
                }
            }

            uint rootObjectStoreInlineCacheEnd = this->GetInlineCacheCount();
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    if (IsScriptContextShutdown)
                    {
                        ((InlineCache*)this->inlineCaches[i])->Clear();
                    }
                    else
                    {
                        // A single root object inline caches for a given property is shared by all functions.  It is ref counted
                        // and doesn't get released to the allocator until there are no more outstanding references.  Thus we don't need
                        // to (and, in fact, cannot) remove it from the invalidation list here.  Instead, we'll do it in ReleaseInlineCache
                        // when there are no more outstanding references.
                        unregisteredInlineCacheCount += rootObjectBase->ReleaseInlineCache(this->GetPropertyIdFromCacheId(i), false, true, IsScriptContextShutdown);
                    }
                }
            }

            uint totalCacheCount = GetInlineCacheCount() + GetIsInstInlineCacheCount();
            for (; i < totalCacheCount; i++)
            {
                if (nullptr != this->inlineCaches[i])
                {
                    IsInstInlineCache* inlineCache = (IsInstInlineCache*)this->inlineCaches[i];
                    if (IsScriptContextShutdown)
                    {
                        inlineCache->Clear();
                    }
                    else
                    {
                        inlineCache->Unregister(this->m_scriptContext);
                        AllocatorDelete(CacheAllocator, this->m_scriptContext->GetIsInstInlineCacheAllocator(), inlineCache);
                    }
                }
            }

            this->inlineCaches = nullptr;

        }

        auto codeGenRuntimeData = this->GetCodeGenRuntimeData();
        if (nullptr != codeGenRuntimeData)
        {
            for (ProfileId i = 0; i < this->profiledCallSiteCount; i++)
            {
                const FunctionCodeGenRuntimeData* runtimeData = codeGenRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        if (codeGenGetSetRuntimeData != nullptr)
        {
            for (uint i = 0; i < this->GetInlineCacheCount(); i++)
            {
                auto runtimeData = codeGenGetSetRuntimeData[i];
                if (nullptr != runtimeData)
                {
                    runtimeData->MapInlineCaches([&](InlineCache* inlineCache)
                    {
                        if (nullptr != inlineCache)
                        {
                            if (IsScriptContextShutdown)
                            {
                                inlineCache->Clear();
                            }
                            else
                            {
                                if (inlineCache->RemoveFromInvalidationList())
                                {
                                    unregisteredInlineCacheCount++;
                                }
                                AllocatorDelete(InlineCacheAllocator, this->m_scriptContext->GetInlineCacheAllocator(), inlineCache);
                            }
                        }
                    });
                }
            }
        }

        if (unregisteredInlineCacheCount > 0)
        {
            AssertMsg(!IsScriptContextShutdown, "Unregistration of inlineCache should only be done if this is not scriptContext shutdown.");
            ThreadContext* threadContext = this->m_scriptContext->GetThreadContext();
            threadContext->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }

        while (this->GetPolymorphicInlineCachesHead())
        {
            this->GetPolymorphicInlineCachesHead()->Finalize(IsScriptContextShutdown);
        }
        polymorphicInlineCaches.Reset();
    }